

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testInit
          (UniformBlockMemberOverlappingOffsetsTest *this)

{
  pointer *pptVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  int iVar5;
  GLuint GVar6;
  GLuint GVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  iterator __position;
  _Alloc_hider this_00;
  GLuint stage;
  long lVar14;
  GLuint stage_1;
  STAGES SVar15;
  bool bVar16;
  testCase test_case;
  bool stage_support [6];
  Type local_98;
  Type local_88;
  undefined1 local_7c [36];
  _Alloc_hider local_58;
  uint local_50;
  GLuint local_4c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  ulong local_38;
  
  lVar14 = 0;
  do {
    this_00._M_p = (pointer)this;
    iVar5 = (*(this->super_NegativeTestBase).super_TestBase.super_TestCase.super_TestCase.
              super_TestNode._vptr_TestNode[0xc])();
    local_48._M_local_buf[lVar14 + 10] = (char)iVar5;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 6);
  local_58._M_p = (pointer)&this->m_test_cases;
  local_38 = 0;
  do {
    local_88 = TestBase::getType((TestBase *)this_00._M_p,(GLuint)local_38);
    this_00._M_p = (pointer)&local_88;
    GVar6 = Utils::Type::GetBaseAlignment((Type *)this_00._M_p,false);
    local_50 = GVar6 + (GVar6 == 0);
    GVar6 = 0;
    do {
      uVar11 = local_50;
      local_4c = GVar6;
      local_98 = TestBase::getType((TestBase *)this_00._M_p,GVar6);
      GVar6 = Utils::Type::GetBaseAlignment(&local_98,false);
      GVar7 = Utils::Type::GetBaseAlignment(&local_98,false);
      uVar8 = GVar7 + (GVar7 == 0);
      uVar12 = (ulong)uVar11;
      uVar9 = uVar8;
      do {
        uVar13 = uVar12;
        uVar4 = (ulong)uVar9;
        if (uVar9 < (uint)uVar12) {
          uVar13 = (ulong)uVar9;
          uVar4 = uVar12;
        }
        uVar9 = (uint)(uVar4 % uVar13);
        uVar12 = uVar13;
      } while (uVar9 != 0);
      uVar9 = (uint)((uVar8 * uVar11) / uVar13);
      uVar10 = (uVar9 + 1) % uVar8;
      iVar5 = uVar8 - uVar10;
      if (uVar10 == 0) {
        iVar5 = 0;
      }
      local_48._M_allocated_capacity._4_4_ = iVar5 + uVar9 + 1;
      this_00._M_p = (pointer)(ulong)(uint)local_48._M_allocated_capacity._4_4_;
      uVar10 = (uVar9 - GVar6) % uVar8;
      iVar5 = uVar8 - uVar10;
      if (uVar10 == 0) {
        iVar5 = 0;
      }
      local_48._M_allocated_capacity._0_4_ = iVar5 + (uVar9 - GVar6);
      bVar2 = (uint)local_48._M_allocated_capacity._0_4_ < uVar9;
      uVar8 = uVar8 + local_48._M_allocated_capacity._0_4_;
      bVar16 = uVar9 < (uint)local_48._M_allocated_capacity._4_4_;
      bVar3 = (uint)local_48._M_allocated_capacity._4_4_ < uVar9 + uVar11;
      lVar14 = 0;
      do {
        if (local_48._M_local_buf[lVar14 + 10] != '\0') {
          __position._M_current =
               (this->m_test_cases).
               super__Vector_base<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          SVar15 = (STAGES)lVar14;
          if (uVar9 < uVar8 && bVar2) {
            local_7c._12_4_ = local_88.m_n_rows;
            local_7c._4_4_ = local_88.m_basic_type;
            local_7c._8_4_ = local_88.m_n_columns;
            local_7c._16_4_ = local_48._M_allocated_capacity._0_4_;
            local_7c._28_4_ = local_98.m_n_rows;
            local_7c._20_4_ = local_98.m_basic_type;
            local_7c._24_4_ = local_98.m_n_columns;
            if (__position._M_current ==
                (this->m_test_cases).
                super__Vector_base<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              this_00._M_p = local_58._M_p;
              local_7c._0_4_ = uVar9;
              local_7c._32_4_ = SVar15;
              std::
              vector<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>>
              ::
              _M_realloc_insert<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase_const&>
                        ((vector<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>>
                          *)local_58._M_p,__position,(testCase *)local_7c);
              __position._M_current =
                   (this->m_test_cases).
                   super__Vector_base<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              (__position._M_current)->m_stage = SVar15;
              (__position._M_current)->m_man_offset = local_48._0_4_;
              ((__position._M_current)->m_man_type).m_basic_type = local_7c._20_4_;
              ((__position._M_current)->m_man_type).m_n_columns = (int)local_98._4_8_;
              ((__position._M_current)->m_man_type).m_n_rows = (int)((ulong)local_98._4_8_ >> 0x20);
              (__position._M_current)->m_boy_offset = uVar9;
              ((__position._M_current)->m_boy_type).m_basic_type = local_7c._4_4_;
              ((__position._M_current)->m_boy_type).m_n_columns = (int)local_88._4_8_;
              ((__position._M_current)->m_boy_type).m_n_rows = (int)((ulong)local_88._4_8_ >> 0x20);
              __position._M_current =
                   (this->m_test_cases).
                   super__Vector_base<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
              (this->m_test_cases).
              super__Vector_base<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_finish = __position._M_current;
            }
          }
          if (bVar3 && bVar16) {
            local_7c._12_4_ = local_88.m_n_rows;
            local_7c._4_4_ = local_88.m_basic_type;
            local_7c._8_4_ = local_88.m_n_columns;
            local_7c._16_4_ = local_48._M_allocated_capacity._4_4_;
            local_7c._28_4_ = local_98.m_n_rows;
            local_7c._20_4_ = local_98.m_basic_type;
            local_7c._24_4_ = local_98.m_n_columns;
            if (__position._M_current ==
                (this->m_test_cases).
                super__Vector_base<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              this_00._M_p = local_58._M_p;
              local_7c._0_4_ = uVar9;
              local_7c._32_4_ = SVar15;
              std::
              vector<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>>
              ::
              _M_realloc_insert<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase_const&>
                        ((vector<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>>
                          *)local_58._M_p,__position,(testCase *)local_7c);
              __position._M_current =
                   (this->m_test_cases).
                   super__Vector_base<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              (__position._M_current)->m_stage = SVar15;
              (__position._M_current)->m_man_offset = local_48._4_4_;
              ((__position._M_current)->m_man_type).m_basic_type = local_7c._20_4_;
              ((__position._M_current)->m_man_type).m_n_columns = (int)local_98._4_8_;
              ((__position._M_current)->m_man_type).m_n_rows = (int)((ulong)local_98._4_8_ >> 0x20);
              (__position._M_current)->m_boy_offset = uVar9;
              ((__position._M_current)->m_boy_type).m_basic_type = local_7c._4_4_;
              ((__position._M_current)->m_boy_type).m_n_columns = (int)local_88._4_8_;
              ((__position._M_current)->m_boy_type).m_n_rows = (int)((ulong)local_88._4_8_ >> 0x20);
              __position._M_current =
                   (this->m_test_cases).
                   super__Vector_base<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
              (this->m_test_cases).
              super__Vector_base<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_finish = __position._M_current;
            }
          }
          local_7c._12_4_ = local_88.m_n_rows;
          local_7c._4_4_ = local_88.m_basic_type;
          local_7c._8_4_ = local_88.m_n_columns;
          local_7c._28_4_ = local_98.m_n_rows;
          local_7c._20_4_ = local_98.m_basic_type;
          local_7c._24_4_ = local_98.m_n_columns;
          local_7c._16_4_ = uVar9;
          if (__position._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this_00._M_p = local_58._M_p;
            local_7c._0_4_ = uVar9;
            local_7c._32_4_ = SVar15;
            std::
            vector<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>>
            ::
            _M_realloc_insert<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase_const&>
                      ((vector<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>>
                        *)local_58._M_p,__position,(testCase *)local_7c);
          }
          else {
            (__position._M_current)->m_stage = SVar15;
            (__position._M_current)->m_man_offset = uVar9;
            ((__position._M_current)->m_man_type).m_basic_type = local_7c._20_4_;
            ((__position._M_current)->m_man_type).m_n_columns = (int)local_98._4_8_;
            ((__position._M_current)->m_man_type).m_n_rows = (int)((ulong)local_98._4_8_ >> 0x20);
            (__position._M_current)->m_boy_offset = uVar9;
            ((__position._M_current)->m_boy_type).m_basic_type = local_7c._4_4_;
            ((__position._M_current)->m_boy_type).m_n_columns = (int)local_88._4_8_;
            ((__position._M_current)->m_boy_type).m_n_rows = (int)((ulong)local_88._4_8_ >> 0x20);
            pptVar1 = &(this->m_test_cases).
                       super__Vector_base<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pptVar1 = *pptVar1 + 1;
            local_7c._0_4_ = uVar9;
            local_7c._32_4_ = SVar15;
          }
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 6);
      GVar6 = local_4c + 1;
    } while (GVar6 != 0x22);
    uVar11 = (int)local_38 + 1;
    local_38 = (ulong)uVar11;
  } while (uVar11 != 0x22);
  return;
}

Assistant:

void UniformBlockMemberOverlappingOffsetsTest::testInit()
{
	const GLuint n_types = getTypesNumber();
	bool		 stage_support[Utils::Shader::STAGE_MAX];

	for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
	{
		stage_support[stage] = isStageSupported((Utils::Shader::STAGES)stage);
	}

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& boy_type = getType(i);
		const GLuint	   boy_size = boy_type.GetActualAlignment(1 /* align */, false /* is_array*/);

		for (GLuint j = 0; j < n_types; ++j)
		{
			const Utils::Type& man_type  = getType(j);
			const GLuint	   man_align = man_type.GetBaseAlignment(false);
			const GLuint	   man_size  = man_type.GetActualAlignment(1 /* align */, false /* is_array*/);

			const GLuint boy_offset		  = lcm(boy_size, man_size);
			const GLuint man_after_start  = boy_offset + 1;
			const GLuint man_after_off	= man_type.GetActualOffset(man_after_start, man_size);
			const GLuint man_before_start = boy_offset - man_align;
			const GLuint man_before_off   = man_type.GetActualOffset(man_before_start, man_size);

			for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
			{
				if (false == stage_support[stage])
				{
					continue;
				}

				if ((boy_offset > man_before_off) && (boy_offset < man_before_off + man_size))
				{
					testCase test_case = { boy_offset, boy_type, man_before_off, man_type,
										   (Utils::Shader::STAGES)stage };

					m_test_cases.push_back(test_case);
				}

				if ((boy_offset < man_after_off) && (boy_offset + boy_size > man_after_off))
				{
					testCase test_case = { boy_offset, boy_type, man_after_off, man_type,
										   (Utils::Shader::STAGES)stage };

					m_test_cases.push_back(test_case);
				}

				/* Boy offset, should be fine for both types */
				testCase test_case = { boy_offset, boy_type, boy_offset, man_type, (Utils::Shader::STAGES)stage };

				m_test_cases.push_back(test_case);
			}
		}
	}
}